

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  REF_INT cell;
  REF_BOOL again;
  REF_INT nodes [27];
  REF_BOOL local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  REF_INT local_94;
  REF_INT local_90;
  REF_INT local_8c;
  
  ref_cell = ref_shard->grid->cell[0xb];
  do {
    local_ac = 0;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,cell,&local_a8);
        if (RVar1 == 0) {
          uVar2 = ref_shard_pair(ref_shard,&local_ac,local_a4,local_98,local_a0,local_8c);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0xf2,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
            return uVar2;
          }
          uVar2 = ref_shard_pair(ref_shard,&local_ac,local_94,local_a8,local_90,local_9c);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0xf5,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
            return uVar2;
          }
          uVar2 = ref_shard_pair(ref_shard,&local_ac,local_a4,local_90,local_a8,local_8c);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0xf9,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
            return uVar2;
          }
          uVar2 = ref_shard_pair(ref_shard,&local_ac,local_94,local_a0,local_98,local_9c);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0xfc,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
            return uVar2;
          }
          uVar2 = ref_shard_pair(ref_shard,&local_ac,local_a8,local_a0,local_98,local_90);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x100,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
            return uVar2;
          }
          uVar2 = ref_shard_pair(ref_shard,&local_ac,local_a4,local_9c,local_94,local_8c);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x103,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
            return uVar2;
          }
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    if (local_ac == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard) {
  REF_CELL ref_cell;
  REF_BOOL again;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_hex(ref_shard_grid(ref_shard));

  again = REF_TRUE;

  while (again) {
    again = REF_FALSE;

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[4], nodes[2],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[0], nodes[6],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[6], nodes[0],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[2], nodes[4],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[0], nodes[2], nodes[4],
                         nodes[6]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[3], nodes[5],
                         nodes[7]),
          "not consist");
    }
  }

  return REF_SUCCESS;
}